

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_iterator.cpp
# Opt level: O1

int main(void)

{
  List<Employee_*> *pLVar1;
  Employee **ppEVar2;
  Employee *pEVar3;
  int iVar4;
  undefined **local_30;
  List<Employee_*> *local_28;
  long local_20;
  
  pLVar1 = (List<Employee_*> *)operator_new(0x18);
  pLVar1->_size = 200;
  pLVar1->_count = 0;
  ppEVar2 = (Employee **)operator_new__(0x640);
  pLVar1->_items = ppEVar2;
  pEVar3 = (Employee *)operator_new(1);
  *ppEVar2 = pEVar3;
  pLVar1->_count = 1;
  pEVar3 = (Employee *)operator_new(1);
  ppEVar2[1] = pEVar3;
  pLVar1->_count = 2;
  pEVar3 = (Employee *)operator_new(1);
  pLVar1->_items[2] = pEVar3;
  pLVar1->_count = 3;
  local_30 = &PTR_First_00103d48;
  local_20 = 0;
  if (0 < pLVar1->_count) {
    iVar4 = 10;
    local_28 = pLVar1;
    do {
      (*(code *)local_30[2])(&local_30);
      List<Employee_*>::Get(local_28,local_20);
      Employee::Print();
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        return 0;
      }
      local_20 = local_20 + 1;
    } while (local_20 < local_28->_count);
  }
  return 0;
}

Assistant:

int main()
{
    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);


    ListIterator<Employee*> i(employees);
    int count = 0;
    
    for (i.First(); !i.IsDone(); i.Next()) {
        count++;
        i.CurrentItem()->Print();
    
        if (count >= 10) {
            break;
        }
    }

}